

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DoubleDatatypeValidator.cpp
# Opt level: O3

XProtoType * __thiscall
xercesc_4_0::DoubleDatatypeValidator::getProtoType(DoubleDatatypeValidator *this)

{
  return (XProtoType *)classDoubleDatatypeValidator;
}

Assistant:

void DoubleDatatypeValidator::serialize(XSerializeEngine& serEng)
{
    /***
     * Note: 
     *
     *     During storing, we need write the specific number
     *     type info before calling base::serialize().
     *
     *     While loading, we do nothing here
     ***/

    if (serEng.isStoring())
    {
        serEng<<(int) (XMLNumber::Double);
    }

    AbstractNumericValidator::serialize(serEng);

}